

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

bool flatbuffers::SetGlobalTestLocale(char *locale_name,string *_value)

{
  char *__s;
  allocator<char> local_39;
  string local_38 [32];
  
  __s = setlocale(6,locale_name);
  if (_value != (string *)0x0 && __s != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
    std::__cxx11::string::operator=((string *)_value,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return __s != (char *)0x0;
}

Assistant:

bool SetGlobalTestLocale(const char *locale_name, std::string *_value) {
  const auto the_locale = setlocale(LC_ALL, locale_name);
  if (!the_locale) return false;
  if (_value) *_value = std::string(the_locale);
  return true;
}